

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

int Abc_NtkToSop(Abc_Ntk_t *pNtk,int fMode,int nCubeLimit)

{
  int iVar1;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x494,"int Abc_NtkToSop(Abc_Ntk_t *, int, int)");
  }
  iVar1 = 1;
  switch(pNtk->ntkFunc) {
  case ABC_FUNC_SOP:
    if (fMode == -1) {
      return 1;
    }
    iVar1 = Abc_NtkSopToBdd(pNtk);
    break;
  case ABC_FUNC_BDD:
    goto switchD_00846874_caseD_2;
  case ABC_FUNC_AIG:
    iVar1 = Abc_NtkAigToBdd(pNtk);
    break;
  case ABC_FUNC_MAP:
    Abc_NtkMapToSop(pNtk);
    return 1;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x4a9,"int Abc_NtkToSop(Abc_Ntk_t *, int, int)");
  case ABC_FUNC_BLACKBOX:
    goto switchD_00846874_caseD_6;
  }
  if (iVar1 != 0) {
switchD_00846874_caseD_2:
    iVar1 = Abc_NtkBddToSop(pNtk,fMode,nCubeLimit);
    return iVar1;
  }
  iVar1 = 0;
switchD_00846874_caseD_6:
  return iVar1;
}

Assistant:

int Abc_NtkToSop( Abc_Ntk_t * pNtk, int fMode, int nCubeLimit )
{
    assert( !Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkHasBlackbox(pNtk) )
        return 1;
    if ( Abc_NtkHasSop(pNtk) )
    {
        if ( fMode == -1 )
            return 1;
        if ( !Abc_NtkSopToBdd(pNtk) )
            return 0;
        return Abc_NtkBddToSop(pNtk, fMode, nCubeLimit);
    }
    if ( Abc_NtkHasMapping(pNtk) )
        return Abc_NtkMapToSop(pNtk);
    if ( Abc_NtkHasBdd(pNtk) )
        return Abc_NtkBddToSop(pNtk, fMode, nCubeLimit);
    if ( Abc_NtkHasAig(pNtk) )
    {
        if ( !Abc_NtkAigToBdd(pNtk) )
            return 0;
        return Abc_NtkBddToSop(pNtk, fMode, nCubeLimit);
    }
    assert( 0 );
    return 0;
}